

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bsp.cc
# Opt level: O0

void bsp_check_exit(void)

{
  int local_10;
  int local_c;
  int fini;
  int init;
  
  if (s_expect_abort_msg != (char *)0x0) {
    fprintf(_stderr,"An error should have been detected \'%s\'\n",s_expect_abort_msg);
    abort();
  }
  local_c = 0;
  local_10 = 0;
  MPI_Initialized(&local_c);
  MPI_Finalized(&local_10);
  if (((local_c != 0) && (local_10 == 0)) && ((s_aborting & 1U) == 0)) {
    if (s_spmd != (Spmd *)0x0) {
      fprintf(_stderr,"bsp_end: was not called before end of program\n");
      MPI_Abort(&ompi_mpi_comm_world,1);
    }
    MPI_Abort(&ompi_mpi_comm_world,0);
  }
  return;
}

Assistant:

static void bsp_check_exit(void) 
{
    if ( s_expect_abort_msg ) {
        std::fprintf(stderr, "An error should have been detected '%s'\n",
                s_expect_abort_msg );
        std::abort();
    }

    int init = 0, fini = 0;
    MPI_Initialized(&init);
    MPI_Finalized(&fini);
    if (init && !fini && !s_aborting ) {
        // calling mpi_finalize() in atexit handler, might
        // deadlock some MPI implementations (Microsoft, IBM)
        if (s_spmd) {
            std::fprintf( stderr, "bsp_end: was not called before end of program\n");
            MPI_Abort( MPI_COMM_WORLD, EXIT_FAILURE );
        }
        MPI_Abort( MPI_COMM_WORLD, EXIT_SUCCESS );
    }
}